

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O0

int run_test_timer_no_double_call_nowait(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uint64_t timeout_ms;
  uv_timer_t timer_handle;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&timeout_ms);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,0x1ae,"uv_timer_init(uv_default_loop(), &timer_handle)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_timer_start(&timeout_ms,timer_check_double_call,10);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,0x1b2,"uv_timer_start(&timer_handle, timer_check_double_call, timeout_ms, timeout_ms)",
            "==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_sleep(0x14);
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,2);
  if ((long)iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,0x1b4,"1","==","uv_run(uv_default_loop(), UV_RUN_NOWAIT)",1,"==",(long)iVar1);
    abort();
  }
  if ((long)timer_check_double_call_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,0x1b5,"1","==","timer_check_double_call_called",1,"==",
            (long)timer_check_double_call_called);
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,0x1b7,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(timer_no_double_call_nowait) {
  uv_timer_t timer_handle;
  const uint64_t timeout_ms = 10;

  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer_handle));
  ASSERT_OK(uv_timer_start(&timer_handle,
                           timer_check_double_call,
                           timeout_ms,
                           timeout_ms));
  uv_sleep(timeout_ms * 2);
  ASSERT_EQ(1, uv_run(uv_default_loop(), UV_RUN_NOWAIT));
  ASSERT_EQ(1, timer_check_double_call_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}